

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

void __thiscall TcpServer::start(TcpServer *this)

{
  bool bVar1;
  log_level lVar2;
  Logger *pLVar3;
  EventLoop *pEVar4;
  reference ppEVar5;
  pointer f;
  pointer this_00;
  anon_class_8_1_8991fb9c local_80;
  Task local_78;
  undefined1 *local_58;
  undefined1 local_50 [24];
  EventLoop *ev;
  EventLoop *local_28;
  int local_1c;
  int i;
  TcpServer *local_10;
  TcpServer *this_local;
  
  local_10 = this;
  if ((this->ts_started & 1U) == 0) {
    Timer::run(&this->ts_timer);
    this->ts_started = true;
    pLVar3 = Logger::get_instance();
    bVar1 = Logger::is_inited(pLVar3);
    if ((!bVar1) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x27);
    }
    lVar2 = Logger::get_log_level();
    if (1 < (int)lVar2) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                        ,"start",0x27,LOG_LEVEL_INFO,
                        "tcp server create thread pool, thread num is %d\n",this->ts_thread_num);
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    std::make_unique<Threadpool,int&>((int *)&stack0xffffffffffffffe8);
    std::unique_ptr<Threadpool,_std::default_delete<Threadpool>_>::operator=
              (&this->ts_thread_pool,
               (unique_ptr<Threadpool,_std::default_delete<Threadpool>_> *)&stack0xffffffffffffffe8)
    ;
    std::unique_ptr<Threadpool,_std::default_delete<Threadpool>_>::~unique_ptr
              ((unique_ptr<Threadpool,_std::default_delete<Threadpool>_> *)&stack0xffffffffffffffe8)
    ;
    bVar1 = std::operator==(&this->ts_thread_pool,(nullptr_t)0x0);
    if (bVar1) {
      if (-1 < pr_level) {
        printf("[%-5s][%s:%d] tcp_server failed to create thread_pool\n","error","start",0x29);
      }
      exit(1);
    }
    for (local_1c = 0; local_1c < this->ts_thread_num; local_1c = local_1c + 1) {
      pEVar4 = (EventLoop *)operator_new(0x70);
      EventLoop::EventLoop(pEVar4);
      local_28 = pEVar4;
      std::vector<EventLoop*,std::allocator<EventLoop*>>::emplace_back<EventLoop*>
                ((vector<EventLoop*,std::allocator<EventLoop*>> *)&this->ts_conn_loops,
                 &stack0xffffffffffffffd8);
      ppEVar5 = std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::operator[]
                          (&this->ts_conn_loops,(long)local_1c);
      local_50._16_8_ = *ppEVar5;
      pLVar3 = Logger::get_instance();
      bVar1 = Logger::is_inited(pLVar3);
      if ((!bVar1) && (-1 < pr_level)) {
        printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x30);
      }
      lVar2 = Logger::get_log_level();
      if (1 < (int)lVar2) {
        pLVar3 = Logger::get_instance();
        Logger::write_log(pLVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                          ,"start",0x30,LOG_LEVEL_INFO,"tcp server add loop_task to thread pool\n");
        pLVar3 = Logger::get_instance();
        Logger::flush(pLVar3);
      }
      f = std::unique_ptr<Threadpool,_std::default_delete<Threadpool>_>::operator->
                    (&this->ts_thread_pool);
      local_58 = local_50 + 0x10;
      Threadpool::post_task<TcpServer::start()::__0>
                ((Threadpool *)local_50,(anon_class_8_1_3fcf656f_for__M_f *)f);
      std::future<void>::~future((future<void> *)local_50);
    }
  }
  this_00 = std::unique_ptr<Acceptor,_std::default_delete<Acceptor>_>::operator->
                      (&this->ts_acceptor);
  bVar1 = Acceptor::is_listenning(this_00);
  if (!bVar1) {
    pLVar3 = Logger::get_instance();
    bVar1 = Logger::is_inited(pLVar3);
    if ((!bVar1) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x37);
    }
    lVar2 = Logger::get_log_level();
    if (1 < (int)lVar2) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                        ,"start",0x37,LOG_LEVEL_INFO,
                        "tcp server add listen task to accpetor eventloop\n");
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    pEVar4 = this->ts_acceptor_loop;
    local_80.this = this;
    std::function<void()>::function<TcpServer::start()::__1,void>
              ((function<void()> *)&local_78,&local_80);
    EventLoop::add_task(pEVar4,&local_78);
    std::function<void_()>::~function(&local_78);
  }
  return;
}

Assistant:

void TcpServer::start() {
    if (!ts_started)
    {
        ts_timer.run();
        ts_started = true;
LOG_INFO("tcp server create thread pool, thread num is %d\n", ts_thread_num);
        if(ts_thread_pool = make_unique<Threadpool>(ts_thread_num); ts_thread_pool==nullptr) {
            PR_ERROR("tcp_server failed to create thread_pool\n");
            exit(1);
        }
        for(int i=0; i<ts_thread_num; i++)
        {
            ts_conn_loops.emplace_back(new EventLoop());
            EventLoop* ev = ts_conn_loops[i];
LOG_INFO("tcp server add loop_task to thread pool\n");
            ts_thread_pool->post_task([&ev]() { ev->loop(); });
        }
    }

    if (!ts_acceptor->is_listenning())
    {
LOG_INFO("tcp server add listen task to accpetor eventloop\n");
        ts_acceptor_loop->add_task([this](){ this->ts_acceptor->listen(); });
    }
}